

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmGeneratorTarget *target,char *make,cmLocalGenerator *lg,char *compiler)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  _Alloc_hider _Var2;
  int iVar3;
  TargetType TVar4;
  char *pcVar5;
  ostream *poVar6;
  cmExtraCodeBlocksGenerator *this_01;
  _Rb_tree_node_base *p_Var7;
  pointer pbVar8;
  allocator local_1ff;
  allocator local_1fe;
  allocator local_1fd;
  allocator local_1fc;
  allocator local_1fb;
  allocator local_1fa;
  allocator local_1f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqIncludeDirs;
  string systemIncludeDirs;
  string buildType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string location;
  string workingDir;
  string makefileName;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = lg->Makefile;
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::__cxx11::string::string((string *)&makefileName,pcVar5,(allocator *)&uniqIncludeDirs);
  std::__cxx11::string::append((char *)&makefileName);
  poVar6 = std::operator<<((ostream *)fout,"      <Target title=\"");
  poVar6 = std::operator<<(poVar6,(string *)targetName);
  std::operator<<(poVar6,"\">\n");
  if (target == (cmGeneratorTarget *)0x0) {
    poVar6 = std::operator<<((ostream *)fout,"         <Option working_dir=\"");
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::operator<<(poVar6,"\" />\n");
    poVar6 = std::operator<<(poVar6,"         <Option type=\"");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,4);
    std::operator<<(poVar6,"\" />\n");
  }
  else {
    iVar3 = GetCBTargetType((cmExtraCodeBlocksGenerator *)poVar6,target);
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    std::__cxx11::string::string((string *)&workingDir,pcVar5,(allocator *)&uniqIncludeDirs);
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 == EXECUTABLE) {
      std::__cxx11::string::string
                ((string *)&uniqIncludeDirs,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",(allocator *)&buildType
                );
      pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&uniqIncludeDirs);
      std::__cxx11::string::~string((string *)&uniqIncludeDirs);
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&uniqIncludeDirs,"EXECUTABLE_OUTPUT_PATH",(allocator *)&buildType);
        pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&uniqIncludeDirs);
        std::__cxx11::string::~string((string *)&uniqIncludeDirs);
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&workingDir);
        }
      }
      else {
        std::__cxx11::string::assign((char *)&workingDir);
      }
    }
    std::__cxx11::string::string
              ((string *)&uniqIncludeDirs,"CMAKE_BUILD_TYPE",(allocator *)&location);
    this_01 = (cmExtraCodeBlocksGenerator *)
              cmMakefile::GetSafeDefinition(this_00,(string *)&uniqIncludeDirs);
    std::__cxx11::string::string
              ((string *)&buildType,(char *)this_01,(allocator *)&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&uniqIncludeDirs);
    location._M_dataplus._M_p = (pointer)&location.field_2;
    location._M_string_length = 0;
    location.field_2._M_local_buf[0] = '\0';
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_((string *)&uniqIncludeDirs,this_01,lg,target);
      std::__cxx11::string::operator=((string *)&location,(string *)&uniqIncludeDirs);
      std::__cxx11::string::~string((string *)&uniqIncludeDirs);
    }
    else {
      cmGeneratorTarget::GetLocation(target,&buildType);
      std::__cxx11::string::assign((char *)&location);
    }
    poVar6 = std::operator<<((ostream *)fout,"         <Option output=\"");
    poVar6 = std::operator<<(poVar6,(string *)&location);
    poVar6 = std::operator<<(poVar6,
                             "\" prefix_auto=\"0\" extension_auto=\"0\" />\n         <Option working_dir=\""
                            );
    poVar6 = std::operator<<(poVar6,(string *)&workingDir);
    poVar6 = std::operator<<(poVar6,
                             "\" />\n         <Option object_output=\"./\" />\n         <Option type=\""
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
    poVar6 = std::operator<<(poVar6,"\" />\n         <Option compiler=\"");
    poVar6 = std::operator<<(poVar6,compiler);
    std::operator<<(poVar6,"\" />\n         <Compiler>\n");
    cdefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cdefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cdefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&uniqIncludeDirs,"C",(allocator *)&systemIncludeDirs);
    cmGeneratorTarget::GetCompileDefinitions(target,&cdefs,&buildType,(string *)&uniqIncludeDirs);
    std::__cxx11::string::~string((string *)&uniqIncludeDirs);
    for (pbVar8 = cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != cdefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      cmXMLSafe::cmXMLSafe((cmXMLSafe *)&systemIncludeDirs,(pbVar8->_M_dataplus)._M_p);
      poVar6 = std::operator<<((ostream *)fout,"            <Add option=\"-D");
      cmXMLSafe::str_abi_cxx11_((string *)&uniqIncludeDirs,(cmXMLSafe *)&systemIncludeDirs);
      poVar6 = std::operator<<(poVar6,(string *)&uniqIncludeDirs);
      std::operator<<(poVar6,"\" />\n");
      std::__cxx11::string::~string((string *)&uniqIncludeDirs);
    }
    p_Var1 = &uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header;
    uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::__cxx11::string::string((string *)&systemIncludeDirs,"C",(allocator *)&dirs);
    cmLocalGenerator::GetIncludeDirectories(lg,&includes,target,&systemIncludeDirs,&buildType,true);
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&uniqIncludeDirs,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string
              ((string *)&dirs,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS",(allocator *)&local_90)
    ;
    pcVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)&dirs);
    std::__cxx11::string::string((string *)&systemIncludeDirs,pcVar5,(allocator *)&local_70);
    std::__cxx11::string::~string((string *)&dirs);
    if (systemIncludeDirs._M_string_length != 0) {
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&systemIncludeDirs,&dirs,false);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&uniqIncludeDirs,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
    }
    std::__cxx11::string::string
              ((string *)&dirs,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS",
               (allocator *)&local_90);
    cmMakefile::GetSafeDefinition(this_00,(string *)&dirs);
    std::__cxx11::string::assign((char *)&systemIncludeDirs);
    std::__cxx11::string::~string((string *)&dirs);
    p_Var7 = uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (systemIncludeDirs._M_string_length != 0) {
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&systemIncludeDirs,&dirs,false);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&uniqIncludeDirs,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
      p_Var7 = uniqIncludeDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    for (; (_Rb_tree_header *)p_Var7 != p_Var1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      poVar6 = std::operator<<((ostream *)fout,"            <Add directory=\"");
      poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 1));
      std::operator<<(poVar6,"\" />\n");
    }
    std::operator<<((ostream *)fout,"         </Compiler>\n");
    std::__cxx11::string::~string((string *)&systemIncludeDirs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&uniqIncludeDirs._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cdefs);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::~string((string *)&buildType);
    std::__cxx11::string::~string((string *)&workingDir);
  }
  poVar6 = std::operator<<((ostream *)fout,"         <MakeCommands>\n            <Build command=\"")
  ;
  std::__cxx11::string::string((string *)&workingDir,make,&local_1f9);
  BuildMakeCommand((string *)&uniqIncludeDirs,this,&workingDir,makefileName._M_dataplus._M_p,
                   targetName);
  poVar6 = std::operator<<(poVar6,(string *)&uniqIncludeDirs);
  poVar6 = std::operator<<(poVar6,"\" />\n            <CompileFile command=\"");
  std::__cxx11::string::string((string *)&location,make,&local_1fa);
  _Var2 = makefileName._M_dataplus;
  std::__cxx11::string::string((string *)&systemIncludeDirs,"&quot;$file&quot;",&local_1fb);
  BuildMakeCommand(&buildType,this,&location,_Var2._M_p,&systemIncludeDirs);
  poVar6 = std::operator<<(poVar6,(string *)&buildType);
  poVar6 = std::operator<<(poVar6,"\" />\n            <Clean command=\"");
  std::__cxx11::string::string((string *)&cdefs,make,&local_1fc);
  _Var2 = makefileName._M_dataplus;
  std::__cxx11::string::string((string *)&includes,"clean",&local_1fd);
  BuildMakeCommand((string *)&dirs,this,(string *)&cdefs,_Var2._M_p,(string *)&includes);
  poVar6 = std::operator<<(poVar6,(string *)&dirs);
  poVar6 = std::operator<<(poVar6,"\" />\n            <DistClean command=\"");
  std::__cxx11::string::string((string *)&local_70,make,&local_1fe);
  std::__cxx11::string::string((string *)&local_50,"clean",&local_1ff);
  BuildMakeCommand(&local_90,this,&local_70,makefileName._M_dataplus._M_p,&local_50);
  poVar6 = std::operator<<(poVar6,(string *)&local_90);
  std::operator<<(poVar6,"\" />\n         </MakeCommands>\n      </Target>\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&dirs);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::~string((string *)&cdefs);
  std::__cxx11::string::~string((string *)&buildType);
  std::__cxx11::string::~string((string *)&systemIncludeDirs);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&uniqIncludeDirs);
  std::__cxx11::string::~string((string *)&workingDir);
  std::__cxx11::string::~string((string *)&makefileName);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(cmGeneratedFileStream& fout,
                                              const std::string& targetName,
                                              cmGeneratorTarget* target,
                                              const char* make,
                                              const cmLocalGenerator* lg,
                                              const char* compiler)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  fout<<"      <Target title=\"" << targetName << "\">\n";
  if (target!=0)
    {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if ( target->GetType()==cmState::EXECUTABLE)
      {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir = makefile->GetDefinition(
                                             "CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != 0)
        {
        workingDir = runtimeOutputDir;
        }
      else
        {
        const char* executableOutputDir = makefile->GetDefinition(
                                                     "EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != 0)
          {
          workingDir = executableOutputDir;
          }
        }
      }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if ( target->GetType()==cmState::OBJECT_LIBRARY)
      {
      location = this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg),
                                             target);
      }
    else
      {
      location = target->GetLocation(buildType);
      }

    fout<<"         <Option output=\"" << location
                            << "\" prefix_auto=\"0\" extension_auto=\"0\" />\n"
          "         <Option working_dir=\"" << workingDir << "\" />\n"
          "         <Option object_output=\"./\" />\n"
          "         <Option type=\"" << cbTargetType << "\" />\n"
          "         <Option compiler=\"" << compiler << "\" />\n"
          "         <Compiler>\n";

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for(std::vector<std::string>::const_iterator di = cdefs.begin();
        di != cdefs.end(); ++di)
      {
      cmXMLSafe safedef(di->c_str());
      fout <<"            <Add option=\"-D" << safedef.str() << "\" />\n";
      }

    // the include directories for this target
    std::set<std::string> uniqIncludeDirs;

    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, target, "C", buildType);

    uniqIncludeDirs.insert(includes.begin(), includes.end());

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
                              "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty())
      {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      uniqIncludeDirs.insert(dirs.begin(), dirs.end());
      }

    systemIncludeDirs = makefile->GetSafeDefinition(
                            "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty())
      {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      uniqIncludeDirs.insert(dirs.begin(), dirs.end());
      }

    for(std::set<std::string>::const_iterator dirIt=uniqIncludeDirs.begin();
        dirIt != uniqIncludeDirs.end();
        ++dirIt)
      {
      fout <<"            <Add directory=\"" << *dirIt << "\" />\n";
      }

    fout<<"         </Compiler>\n";
    }
  else // e.g. all and the GLOBAL and UTILITY targets
    {
    fout<<"         <Option working_dir=\""
        << lg->GetCurrentBinaryDirectory() << "\" />\n"
        <<"         <Option type=\"" << 4 << "\" />\n";
    }

  fout<<"         <MakeCommands>\n"
        "            <Build command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
      << "\" />\n"
        "            <CompileFile command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(),"&quot;$file&quot;")
      << "\" />\n"
        "            <Clean command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), "clean")
      << "\" />\n"
        "            <DistClean command=\""
      << this->BuildMakeCommand(make, makefileName.c_str(), "clean")
      << "\" />\n"
        "         </MakeCommands>\n"
        "      </Target>\n";

}